

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::PostprocessHelper_CollectMetadata
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *pList)

{
  const_iterator this_00;
  bool bVar1;
  reference ppCVar2;
  _Self local_30;
  _Self local_28;
  const_iterator el_it;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *pList_local;
  CX3DImporter_NodeElement *pNodeElement_local;
  X3DImporter *this_local;
  
  el_it._M_node = (_List_node_base *)pList;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
       begin(&pNodeElement->Child);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
         ::end(&pNodeElement->Child);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28);
    if (((((*ppCVar2)->Type == ENET_MetaBoolean) ||
         (ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28),
         (*ppCVar2)->Type == ENET_MetaDouble)) ||
        (ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28),
        (*ppCVar2)->Type == ENET_MetaFloat)) ||
       ((ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28),
        (*ppCVar2)->Type == ENET_MetaInteger ||
        (ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28),
        (*ppCVar2)->Type == ENET_MetaString)))) {
      this_00._M_node = el_it._M_node;
      ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28);
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
                this_00._M_node,ppCVar2);
    }
    else {
      ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28);
      if ((*ppCVar2)->Type == ENET_MetaSet) {
        ppCVar2 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_28);
        PostprocessHelper_CollectMetadata
                  (this,*ppCVar2,
                   (list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
                   el_it._M_node);
      }
    }
    std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator++(&local_28);
  }
  return;
}

Assistant:

void X3DImporter::PostprocessHelper_CollectMetadata(const CX3DImporter_NodeElement& pNodeElement, std::list<CX3DImporter_NodeElement*>& pList) const
{
	// walk through childs and find for metadata.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); ++el_it)
	{
		if(((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaBoolean) || ((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaDouble) ||
			((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaFloat) || ((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaInteger) ||
			((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaString))
		{
			pList.push_back(*el_it);
		}
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaSet)
		{
			PostprocessHelper_CollectMetadata(**el_it, pList);
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); el_it++)
}